

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O1

Token * __thiscall EOPlus::Lexer::ReadOperator(Token *__return_storage_ptr__,Lexer *this)

{
  size_type sVar1;
  char cVar2;
  char a;
  bool bVar3;
  int iVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char cc;
  char c;
  char local_17a;
  char local_179;
  function<bool_(char)> local_178;
  function<bool_(char)> local_158;
  variant local_130;
  variant local_f0;
  variant local_b0;
  variant local_70;
  
  local_179 = '\0';
  local_17a = '\0';
  local_158.super__Function_base._M_functor._8_8_ = 0;
  local_158.super__Function_base._M_functor._M_unused._M_object = ctype_op;
  local_158._M_invoker = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
  local_158.super__Function_base._M_manager =
       std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
  bVar3 = GetCharIf(this,&local_179,&local_158);
  if (local_158.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.super__Function_base._M_manager)
              ((_Any_data *)&local_158,(_Any_data *)&local_158,__destroy_functor);
  }
  if (bVar3) {
    iVar4 = std::istream::peek();
    if (iVar4 != -1) {
      local_17a = (char)iVar4;
    }
    bVar3 = check_op(local_179,local_17a);
    if (bVar3) {
      local_178.super__Function_base._M_functor._8_8_ = 0;
      local_178.super__Function_base._M_functor._M_unused._M_object = ctype_op;
      local_178._M_invoker = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
      local_178.super__Function_base._M_manager =
           std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
      GetCharIf(this,&local_17a,&local_178);
      if (local_178.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_178.super__Function_base._M_manager)
                  ((_Any_data *)&local_178,(_Any_data *)&local_178,__destroy_functor);
      }
    }
    a = local_179;
    cVar2 = local_17a;
    bVar3 = check_op(local_179,local_17a);
    if (bVar3) {
      util::variant::variant(&local_b0,(uint)(byte)((a + cVar2 * '\x04') - 0x20));
      __return_storage_ptr__->type = Operator;
      (__return_storage_ptr__->data).val_int = local_b0.val_int;
      *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = local_b0._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->data).val_float = local_b0.val_float._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) =
           local_b0.val_float._4_4_;
      (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->data).val_string.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(__return_storage_ptr__->data).val_string,
                 local_b0.val_string._M_dataplus._M_p,
                 local_b0.val_string._M_dataplus._M_p + local_b0.val_string._M_string_length);
      paVar5 = &local_b0.val_string.field_2;
    }
    else {
      bVar3 = check_op(a,'\0');
      if (bVar3) {
        util::variant::variant(&local_f0,(uint)(byte)(a - 0x20));
        __return_storage_ptr__->type = Operator;
        (__return_storage_ptr__->data).val_int = local_f0.val_int;
        *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = local_f0._4_4_;
        *(undefined4 *)&(__return_storage_ptr__->data).val_float = local_f0.val_float._0_4_;
        *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) =
             local_f0.val_float._4_4_;
        (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->data).val_string.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(__return_storage_ptr__->data).val_string,
                   local_f0.val_string._M_dataplus._M_p,
                   local_f0.val_string._M_dataplus._M_p + local_f0.val_string._M_string_length);
        paVar5 = &local_f0.val_string.field_2;
      }
      else {
        util::variant::variant(&local_130);
        __return_storage_ptr__->type = Invalid;
        (__return_storage_ptr__->data).val_int = local_130.val_int;
        *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = local_130._4_4_;
        *(undefined4 *)&(__return_storage_ptr__->data).val_float = local_130.val_float._0_4_;
        *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) =
             local_130.val_float._4_4_;
        (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->data).val_string.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(__return_storage_ptr__->data).val_string,
                   local_130.val_string._M_dataplus._M_p,
                   local_130.val_string._M_dataplus._M_p + local_130.val_string._M_string_length);
        paVar5 = &local_130.val_string.field_2;
      }
    }
  }
  else {
    util::variant::variant(&local_70);
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->data).val_int = local_70.val_int;
    *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = local_70._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->data).val_float = local_70.val_float._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) = local_70.val_float._4_4_;
    (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->data).val_string.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->data).val_string,
               local_70.val_string._M_dataplus._M_p,
               local_70.val_string._M_dataplus._M_p + local_70.val_string._M_string_length);
    paVar5 = &local_70.val_string.field_2;
  }
  (__return_storage_ptr__->data).type = *(var_type *)(&paVar5->_M_allocated_capacity + 3);
  sVar1 = (&paVar5->_M_allocated_capacity)[2];
  (__return_storage_ptr__->data).val_bool = (bool)(char)sVar1;
  (__return_storage_ptr__->data).cache_val[0] = (bool)(char)(sVar1 >> 8);
  (__return_storage_ptr__->data).cache_val[1] = (bool)(char)(sVar1 >> 0x10);
  (__return_storage_ptr__->data).cache_val[2] = (bool)(char)(sVar1 >> 0x18);
  (__return_storage_ptr__->data).cache_val[3] = (bool)(char)(sVar1 >> 0x20);
  *(int3 *)&(__return_storage_ptr__->data).field_0x35 = (int3)(sVar1 >> 0x28);
  __return_storage_ptr__->newlines = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar5->_M_allocated_capacity)[-2] != paVar5) {
    operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],paVar5->_M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::ReadOperator()
	{
		char c = '\0';
		char cc = '\0';

		if (!this->GetCharIf(c, ctype_op))
			return Token();

		this->PeekChar(cc);

		if (check_op(c, cc))
			this->GetCharIf(cc, ctype_op);

		if (check_op(c, cc))
			return Token(Token::Operator, UOP2(c, cc));
		else if (check_op(c, '\0'))
			return Token(Token::Operator, UOP2(c, '\0'));
		else
			return Token();
	}